

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsstm.cpp
# Opt level: O2

CTPNStm * __thiscall CTcParser::parse_foreach(CTcParser *this,int *err)

{
  CTcTokFileDesc *pCVar1;
  long lVar2;
  CTcPrsSymtab *pCVar3;
  CTcPrsSymtab *pCVar4;
  textchar_t *sym;
  size_t len;
  CTPNStmEnclosing *pCVar5;
  CTcTokenizer *this_00;
  tc_toktyp_t tVar6;
  int iVar7;
  CTcPrsNode *iter_expr;
  ulong uVar8;
  CTcPrsNode *coll_expr;
  CTPNStmForeach *this_01;
  CTPNStm *pCVar9;
  char *siz;
  
  this_00 = G_tok;
  pCVar1 = G_tok->last_desc_;
  lVar2 = G_tok->last_linenum_;
  pCVar3 = this->local_symtab_;
  pCVar4 = this->enclosing_local_symtab_;
  this->enclosing_local_symtab_ = pCVar3;
  tVar6 = CTcTokenizer::next(this_00);
  if (tVar6 == TOKT_LPAR) {
    CTcTokenizer::next(G_tok);
  }
  else {
    CTcTokenizer::log_error_curtok(G_tok,0x2ba7);
  }
  tVar6 = (G_tok->curtok_).typ_;
  if ((tVar6 != TOKT_SYM) && (tVar6 != TOKT_LPAR)) {
    if (tVar6 != TOKT_LOCAL) {
      CTcTokenizer::log_error_curtok(G_tok,0x2ba8);
      return (CTPNStm *)0x0;
    }
    create_scope_local_symtab(this);
    tVar6 = CTcTokenizer::next(G_tok);
    if (tVar6 == TOKT_SYM) {
      sym = (G_tok->curtok_).text_;
      len = (G_tok->curtok_).text_len_;
      iVar7 = this->local_cnt_;
      if (this->max_local_cnt_ <= iVar7) {
        this->max_local_cnt_ = iVar7 + 1;
      }
      this->local_cnt_ = iVar7 + 1;
      CTcPrsSymtab::add_local(this->local_symtab_,sym,len,iVar7,0,0,0);
    }
    else {
      CTcTokenizer::log_error_curtok(G_tok,0x2b29);
    }
  }
  iter_expr = parse_expr(this);
  if (iter_expr == (CTcPrsNode *)0x0) goto LAB_002038a3;
  if ((G_tok->curtok_).typ_ == TOKT_SYM) {
    siz = "in";
    iVar7 = CTcToken::text_matches(&G_tok->curtok_,"in",2);
    if (iVar7 == 0) goto LAB_00203845;
LAB_00203875:
    CTcTokenizer::next(G_tok);
  }
  else {
LAB_00203845:
    siz = (char *)0x2ba9;
    CTcTokenizer::log_error_curtok(G_tok,0x2ba9);
    uVar8 = (ulong)(G_tok->curtok_).typ_;
    if (uVar8 < 0x2b) {
      if ((0x40001800004U >> (uVar8 & 0x3f) & 1) != 0) {
        return (CTPNStm *)0x0;
      }
      if (uVar8 == 0x14) goto LAB_00203875;
    }
  }
  coll_expr = parse_expr(this);
  if (coll_expr != (CTcPrsNode *)0x0) {
    if ((G_tok->curtok_).typ_ == TOKT_RPAR) {
      CTcTokenizer::next(G_tok);
    }
    else {
      siz = (char *)0x2baa;
      CTcTokenizer::log_error_curtok(G_tok,0x2baa);
    }
    this_01 = (CTPNStmForeach *)CTcPrsAllocObj::operator_new((CTcPrsAllocObj *)0x60,(size_t)siz);
    iVar7 = this->local_cnt_;
    if (this->max_local_cnt_ <= iVar7) {
      this->max_local_cnt_ = iVar7 + 1;
    }
    this->local_cnt_ = iVar7 + 1;
    CTPNStmForeach::CTPNStmForeach
              (this_01,iter_expr,coll_expr,this->local_symtab_,this->enclosing_stm_,iVar7);
    pCVar5 = this->enclosing_stm_;
    this->enclosing_stm_ = (CTPNStmEnclosing *)this_01;
    pCVar9 = parse_stm(this,err,(CTPNStmSwitch *)0x0,0);
    this->enclosing_stm_ = pCVar5;
    if (*err == 0) {
      (this_01->super_CTPNStmForeachBase).body_stm_ = pCVar9;
      (this_01->super_CTPNStmForeachBase).super_CTPNStmEnclosing.super_CTPNStm.super_CTPNStmBase.
      file_ = pCVar1;
      (this_01->super_CTPNStmForeachBase).super_CTPNStmEnclosing.super_CTPNStm.super_CTPNStmBase.
      linenum_ = lVar2;
      (this_01->super_CTPNStmForeachBase).field_0x4c =
           (this_01->super_CTPNStmForeachBase).field_0x4c & 0xfe | this->local_symtab_ != pCVar3;
      this->local_symtab_ = pCVar3;
      this->enclosing_local_symtab_ = pCVar4;
      return (CTPNStm *)this_01;
    }
    return (CTPNStm *)0x0;
  }
LAB_002038a3:
  *err = 1;
  return (CTPNStm *)0x0;
}

Assistant:

CTPNStm *CTcParser::parse_foreach(int *err)
{
    tcprs_scope_t scope_data;
    CTcPrsNode *iter_expr;
    CTcPrsNode *coll_expr;
    CTPNStm *body_stm;
    CTPNStmForeach *foreach_stm;
    CTcTokFileDesc *file;
    long linenum;
    CTPNStmEnclosing *old_enclosing;

    /* save the current line information for later */
    G_tok->get_last_pos(&file, &linenum);

    /* 
     *   enter a scope, in case we create a local symbol table for local
     *   variables defined within the 'for' statement 
     */
    enter_scope(&scope_data);

    /* parse the open paren */
    if (G_tok->next() == TOKT_LPAR)
    {
        /* skip it */
        G_tok->next();
    }
    else
    {
        /* log an error, and proceed, assuming it was simply left out */
        G_tok->log_error_curtok(TCERR_REQ_FOREACH_LPAR);
    }

    /* we don't have the iterator lvalue or collection expression yet */
    iter_expr = 0;
    coll_expr = 0;

    /* check for 'local' before the iteration variable */
    switch (G_tok->cur())
    {
    case TOKT_LOCAL:
        /* 
         *   if we haven't created our own symbol table local to the 'for'
         *   loop, do so now 
         */
        create_scope_local_symtab();

        /* skip the 'local' keyword and get the local name */
        if (G_tok->next() == TOKT_SYM)
        {
            /* add the local symbol */
            local_symtab_->add_local(G_tok->getcur()->get_text(),
                                     G_tok->getcur()->get_text_len(),
                                     alloc_local(), FALSE, FALSE, FALSE);
        }
        else
        {
            /* log the error */
            G_tok->log_error_curtok(TCERR_LOCAL_REQ_SYM);
        }

        /* go handle the local as the iteration expression */
        goto do_expr;

    case TOKT_LPAR:
    case TOKT_SYM:
    do_expr:
        /* parse the iterator lvalue expression */
        iter_expr = parse_expr();
        if (iter_expr == 0)
        {
            *err = TRUE;
            return 0;
        }
        break;
        
    default:
        /* premature end of the list - log an error and stop */
        G_tok->log_error_curtok(TCERR_MISSING_FOREACH_EXPR);
        return 0;
    }

    /* require the 'in' keyword */
    if (G_tok->cur() != TOKT_SYM || !G_tok->getcur()->text_matches("in", 2))
    {
        /* log an error */
        G_tok->log_error_curtok(TCERR_FOREACH_REQ_IN);

        /* see what we have */
        switch(G_tok->cur())
        {
        case TOKT_LBRACE:
        case TOKT_RBRACE:
        case TOKT_SEM:
        case TOKT_EOF:
            /* probably end of statement */
            return 0;
            
        case TOKT_RPAR:
            /* 
             *   probably an extra paren in the variable expression - skip
             *   the paren and continue 
             */
            G_tok->next();
            break;

        default:
            /* probably just left out 'in' - continue from here */
            break;
        }
    }
    else
    {
        /* skip the 'in' */
        G_tok->next();
    }

    /* parse the collection expression */
    coll_expr = parse_expr();
    if (coll_expr == 0)
    {
        *err = TRUE;
        return 0;
    }

    /* make sure we have the close paren */
    if (G_tok->cur() != TOKT_RPAR)
    {
        /* 
         *   log the error, but continue from here on the assumption that
         *   they simply left out the paren 
         */
        G_tok->log_error_curtok(TCERR_REQ_FOREACH_RPAR);
    }
    else
    {
        /* skip the paren */
        G_tok->next();
    }

    /* 
     *   create the "foreach" node, allocating a private local variable
     *   for holding the iterator object 
     */
    foreach_stm = new CTPNStmForeach(iter_expr, coll_expr, 
                                     local_symtab_, enclosing_stm_,
                                     alloc_local());

    /* set the "foreach" node to enclose its body */
    old_enclosing = set_enclosing_stm(foreach_stm);

    /* parse the body of the loop */
    body_stm = parse_stm(err, 0, FALSE);

    /* restore the old enclosing statement */
    set_enclosing_stm(old_enclosing);

    /* if that failed, return failure */
    if (*err)
        return 0;

    /* set the body of the 'for' */
    foreach_stm->set_body(body_stm);

    /* set the original statement position in the node */
    foreach_stm->set_source_pos(file, linenum);

    /* set the own-scope flag */
    foreach_stm->set_has_own_scope(local_symtab_ != scope_data.local_symtab);

    /* exit any local scope we created */
    leave_scope(&scope_data);

    /* return the new statement node */
    return foreach_stm;
}